

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O2

void safe_resizeBuffer(csafestring_t *obj,size_t newLength)

{
  char *__s;
  char *__dest;
  size_t sVar1;
  bool bVar2;
  
  sVar1 = obj->buffer_length;
  bVar2 = true;
  while (sVar1 < newLength + 1) {
    sVar1 = sVar1 * 2;
    obj->buffer_length = sVar1;
    bVar2 = false;
  }
  if (!bVar2) {
    __dest = (char *)calloc(1,sVar1);
    __s = obj->data;
    sVar1 = strlen(__s);
    memmove(__dest,__s,sVar1);
    free(__s);
    obj->data = __dest;
  }
  return;
}

Assistant:

void safe_resizeBuffer(csafestring_t *obj, size_t newLength) {
	char hit = 0;
	newLength++;

	while ( obj->buffer_length < newLength ) {
		hit = 1;
		obj->buffer_length <<= 1;
#ifdef EXPERIMENTAL_SIZING
		obj->sizing_size++;
		sizing_size++;
#endif
	}
	if ( hit ) {
		char *tmp = (char *) calloc(sizeof(char), obj->buffer_length);
		memmove(tmp, obj->data, strlen(obj->data));
		free(obj->data);
		obj->data = tmp;
	}
}